

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# authority_suite.cpp
# Opt level: O0

void __thiscall
reader_authority_suite::test_userinfo_host_port::test_method(test_userinfo_host_port *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  view_type *pvVar4;
  undefined1 local_3b2;
  undefined1 local_3b1;
  basic_cstring<const_char> local_3b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3a0;
  basic_cstring<const_char> local_378;
  basic_cstring<const_char> local_368;
  basic_cstring<const_char> local_358;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_348;
  basic_cstring<const_char> local_320;
  basic_cstring<const_char> local_310;
  undefined4 local_300;
  value local_2fc;
  basic_cstring<const_char> local_2f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2e8;
  basic_cstring<const_char> local_2c0;
  basic_cstring<const_char> local_2b0;
  undefined1 local_29a;
  undefined1 local_299;
  basic_cstring<const_char> local_298;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_288;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  basic_cstring<const_char> local_240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_230;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  undefined4 local_1e8;
  value local_1e4;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1d0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  undefined1 local_182;
  undefined1 local_181;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_170;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_118;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  undefined4 local_cc;
  value local_c8 [4];
  basic_cstring<const_char> local_b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a8;
  basic_cstring<const_char> local_80;
  basic_cstring<const_char> local_70;
  basic_string_ref<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [8];
  authority reader;
  char input [16];
  test_userinfo_host_port *this_local;
  
  reader.super_base<char,_trial::url::reader::basic_authority>.current_token = 0x72657375;
  reader.super_base<char,_trial::url::reader::basic_authority>._36_4_ = 0x322e3140;
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
            (&local_60,
             (char *)&reader.super_base<char,_trial::url::reader::basic_authority>.current_token);
  trial::url::reader::basic_authority<char>::basic_authority
            ((basic_authority<char> *)local_50,&local_60);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_70,0x37,&local_80);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a8,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    local_c8[0] = trial::url::reader::base<char,_trial::url::reader::basic_authority>::code
                            ((base<char,_trial::url::reader::basic_authority> *)local_50);
    local_cc = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
              (&local_a8,&local_b8,0x37,2,2,local_c8,"reader.code()",&local_cc,
               "url::token::code::authority_userinfo");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x38,&local_f0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_118,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    pvVar4 = trial::url::reader::base<char,_trial::url::reader::basic_authority>::literal
                       ((base<char,_trial::url::reader::basic_authority> *)local_50);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
              (&local_118,&local_128,0x38,2,2,pvVar4,"reader.literal()","user","\"user\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_118);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_138,0x39,&local_148);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_170,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    local_181 = trial::url::reader::base<char,_trial::url::reader::basic_authority>::next
                          ((base<char,_trial::url::reader::basic_authority> *)local_50);
    local_182 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_170,&local_180,0x39,2,2,&local_181,"reader.next()",&local_182,"true");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_170);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_198,0x3a,&local_1a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1d0,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    local_1e4 = trial::url::reader::base<char,_trial::url::reader::basic_authority>::code
                          ((base<char,_trial::url::reader::basic_authority> *)local_50);
    local_1e8 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
              (&local_1d0,&local_1e0,0x3a,2,2,&local_1e4,"reader.code()",&local_1e8,
               "url::token::code::authority_host");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x3b,&local_208);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_230,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    pvVar4 = trial::url::reader::base<char,_trial::url::reader::basic_authority>::literal
                       ((base<char,_trial::url::reader::basic_authority> *)local_50);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[8]>
              (&local_230,&local_240,0x3b,2,2,pvVar4,"reader.literal()","1.2.3.4","\"1.2.3.4\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_230);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_260);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_250,0x3c,&local_260);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_288,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    local_299 = trial::url::reader::base<char,_trial::url::reader::basic_authority>::next
                          ((base<char,_trial::url::reader::basic_authority> *)local_50);
    local_29a = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_288,&local_298,0x3c,2,2,&local_299,"reader.next()",&local_29a,"true");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_288);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2b0,0x3d,&local_2c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2e8,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    local_2fc = trial::url::reader::base<char,_trial::url::reader::basic_authority>::code
                          ((base<char,_trial::url::reader::basic_authority> *)local_50);
    local_300 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
              (&local_2e8,&local_2f8,0x3d,2,2,&local_2fc,"reader.code()",&local_300,
               "url::token::code::authority_port");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_320);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_310,0x3e,&local_320);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_348,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_358,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    pvVar4 = trial::url::reader::base<char,_trial::url::reader::basic_authority>::literal
                       ((base<char,_trial::url::reader::basic_authority> *)local_50);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[3]>
              (&local_348,&local_358,0x3e,2,2,pvVar4,"reader.literal()","80","\"80\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_348);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_378);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_368,0x3f,&local_378);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3a0,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/authority_suite.cpp"
               ,0x65);
    local_3b1 = trial::url::reader::base<char,_trial::url::reader::basic_authority>::next
                          ((base<char,_trial::url::reader::basic_authority> *)local_50);
    local_3b2 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_3a0,&local_3b0,0x3f,2,2,&local_3b1,"reader.next()",&local_3b2,"false");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_userinfo_host_port)
{
    const char input[] = "user@1.2.3.4:80";
    url::reader::authority reader(input);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_userinfo);
    BOOST_REQUIRE_EQUAL(reader.literal(), "user");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_host);
    BOOST_REQUIRE_EQUAL(reader.literal(), "1.2.3.4");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::authority_port);
    BOOST_REQUIRE_EQUAL(reader.literal(), "80");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}